

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TiledRgbaInputFile::TiledRgbaInputFile(TiledRgbaInputFile *this,IStream *is,int numThreads)

{
  char *name;
  ContextInitializer *ctxt;
  string local_c8;
  ContextInitializer local_a8;
  
  name = IStream::fileName(is);
  local_a8._prov_stream = (IStream *)0x0;
  local_a8._initializer.size = 0x68;
  local_a8._initializer.error_handler_fn = (exr_error_handler_cb_t)0x0;
  local_a8._initializer.alloc_fn = (exr_memory_allocation_func_t)0x0;
  local_a8._initializer.free_fn = (exr_memory_free_func_t)0x0;
  local_a8._initializer.user_data = (void *)0x0;
  local_a8._initializer.read_fn = (exr_read_func_ptr_t)0x0;
  local_a8._initializer.size_fn = (exr_query_size_func_ptr_t)0x0;
  local_a8._initializer.write_fn = (exr_write_func_ptr_t)0x0;
  local_a8._initializer.destroy_fn = (exr_destroy_stream_func_ptr_t)0x0;
  local_a8._initializer.max_image_width = 0;
  local_a8._initializer.max_image_height = 0;
  local_a8._initializer.max_tile_width = 0;
  local_a8._initializer.max_tile_height = 0;
  local_a8._initializer.zip_level = -2;
  local_a8._initializer.dwa_quality = -1.0;
  local_a8._ctxt_type = TEMP;
  local_a8._108_4_ = 0;
  local_a8._initializer.flags = 2;
  local_a8._initializer.pad[0] = '\0';
  local_a8._initializer.pad[1] = '\0';
  local_a8._initializer.pad[2] = '\0';
  local_a8._initializer.pad[3] = '\0';
  ctxt = ContextInitializer::setInputStream(&local_a8,is);
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  TiledRgbaInputFile(this,name,ctxt,&local_c8,numThreads);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TiledRgbaInputFile::TiledRgbaInputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int numThreads)
    : TiledRgbaInputFile (
        is.fileName (),
        ContextInitializer ()
        .silentHeaderParse (true)
        .strictHeaderValidation (false)
        .setInputStream (&is),
        std::string(),
        numThreads)
{
}